

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  int iVar1;
  long lVar2;
  long *in_RDI;
  mz_uint8 hdr [22];
  mz_uint64 central_dir_size;
  mz_uint64 central_dir_ofs;
  mz_zip_internal_state *pState;
  mz_uint8 amStack_48 [8];
  mz_uint8 amStack_40 [2];
  mz_uint8 amStack_3e [2];
  mz_uint8 amStack_3c [4];
  mz_uint8 amStack_38 [16];
  long local_28;
  long local_20;
  undefined8 *local_18;
  long *local_10;
  mz_bool local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RDI[0xb] == 0)) || (*(int *)((long)in_RDI + 0x14) != 2)) {
    local_4 = 0;
  }
  else {
    local_18 = (undefined8 *)in_RDI[0xb];
    if ((*(uint *)(in_RDI + 2) < 0x10000) && (*in_RDI + local_18[1] + 0x16U < 0x100000000)) {
      local_20 = 0;
      local_28 = 0;
      local_10 = in_RDI;
      if ((int)in_RDI[2] != 0) {
        local_20 = *in_RDI;
        local_28 = local_18[1];
        in_RDI[1] = local_20;
        lVar2 = (*(code *)in_RDI[9])(in_RDI[10],local_20,*local_18,local_28);
        if (lVar2 != local_28) {
          return 0;
        }
        *local_10 = local_28 + *local_10;
      }
      memset(amStack_48,0,0x16);
      mz_write_le32(amStack_48,0x6054b50);
      mz_write_le16(amStack_40,(mz_uint16)(int)local_10[2]);
      mz_write_le16(amStack_3e,(mz_uint16)(int)local_10[2]);
      mz_write_le32(amStack_3c,(mz_uint32)local_28);
      mz_write_le32(amStack_38,(mz_uint32)local_20);
      lVar2 = (*(code *)local_10[9])(local_10[10],*local_10,amStack_48,0x16);
      if (lVar2 == 0x16) {
        if ((local_18[0xc] != 0) && (iVar1 = fflush((FILE *)local_18[0xc]), iVar1 == -1)) {
          return 0;
        }
        *local_10 = *local_10 + 0x16;
        *(undefined4 *)((long)local_10 + 0x14) = 3;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {
  mz_zip_internal_state* pState;
  mz_uint64 central_dir_ofs, central_dir_size;
  mz_uint8 hdr[MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE];

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;

  pState = pZip->m_pState;

  // no zip64 support yet
  if ((pZip->m_total_files > 0xFFFF) || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > 0xFFFFFFFF))
    return MZ_FALSE;

  central_dir_ofs = 0;
  central_dir_size = 0;
  if (pZip->m_total_files) {
    // Write central directory
    central_dir_ofs = pZip->m_archive_size;
    central_dir_size = pState->m_central_dir.m_size;
    pZip->m_central_directory_file_ofs = central_dir_ofs;
    if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs, pState->m_central_dir.m_p, (size_t)central_dir_size) != central_dir_size)
      return MZ_FALSE;
    pZip->m_archive_size += central_dir_size;
  }

  // Write end of central directory record
  MZ_CLEAR_OBJ(hdr);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, central_dir_size);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, central_dir_ofs);

  if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr, sizeof(hdr)) != sizeof(hdr))
    return MZ_FALSE;
#ifndef MINIZ_NO_STDIO
  if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
    return MZ_FALSE;
#endif  // #ifndef MINIZ_NO_STDIO

  pZip->m_archive_size += sizeof(hdr);

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
  return MZ_TRUE;
}